

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

bool bech32::anon_unknown_0::CheckCharacters(string *str,vector<int,_std::allocator<int>_> *errors)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  bVar2 = false;
  for (uVar4 = 0; uVar4 < str->_M_string_length; uVar4 = uVar4 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar4];
    iVar3 = (int)uVar4;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      if (bVar5) {
        local_3c = iVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(errors,&local_3c);
        bVar5 = true;
      }
      else {
        bVar2 = true;
        bVar5 = false;
      }
    }
    else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
      if (bVar2) {
        local_3c = iVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(errors,&local_3c);
        bVar2 = true;
      }
      else {
        bVar5 = true;
        bVar2 = false;
      }
    }
    else if ((byte)(cVar1 + 0x81U) < 0xa2) {
      local_3c = iVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(errors,&local_3c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start ==
           (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckCharacters(const std::string& str, std::vector<int>& errors)
{
    bool lower = false, upper = false;
    for (size_t i = 0; i < str.size(); ++i) {
        unsigned char c{(unsigned char)(str[i])};
        if (c >= 'a' && c <= 'z') {
            if (upper) {
                errors.push_back(i);
            } else {
                lower = true;
            }
        } else if (c >= 'A' && c <= 'Z') {
            if (lower) {
                errors.push_back(i);
            } else {
                upper = true;
            }
        } else if (c < 33 || c > 126) {
            errors.push_back(i);
        }
    }
    return errors.empty();
}